

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::DoWhileStatement(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  SQUnsignedInteger SVar2;
  SQUnsignedInteger SVar3;
  SQUnsignedInteger SVar4;
  SQUnsignedInteger SVar5;
  SQInteger SVar6;
  long lVar7;
  SQFuncState *pSVar8;
  long lVar9;
  SQScope __oldscope__;
  
  Lex(this);
  pSVar8 = this->_fs;
  SVar2 = (pSVar8->_instructions)._size;
  SVar3 = (pSVar8->_unresolvedbreaks)._size;
  SVar4 = (pSVar8->_unresolvedcontinues)._size;
  __oldscope__.outers = 0;
  sqvector<long_long>::push_back(&pSVar8->_breaktargets,&__oldscope__.outers);
  __oldscope__.outers = 0;
  sqvector<long_long>::push_back(&this->_fs->_continuetargets,&__oldscope__.outers);
  __oldscope__.outers = (this->_scope).outers;
  __oldscope__.stacksize = (this->_scope).stacksize;
  pSVar8 = this->_fs;
  (this->_scope).outers = pSVar8->_outers;
  SVar6 = SQFuncState::GetStackSize(pSVar8);
  (this->_scope).stacksize = SVar6;
  Statement(this,true);
  lVar7 = this->_fs->_outers;
  SVar6 = SQFuncState::GetStackSize(this->_fs);
  lVar9 = (this->_scope).stacksize;
  if (SVar6 != lVar9) {
    SQFuncState::SetStackSize(this->_fs,lVar9);
    if (lVar7 != this->_fs->_outers) {
      SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
    }
  }
  (this->_scope).outers = __oldscope__.outers;
  (this->_scope).stacksize = __oldscope__.stacksize;
  Expect(this,0x112);
  SVar5 = (this->_fs->_instructions)._size;
  Expect(this,0x28);
  CommaExpr(this);
  Expect(this,0x29);
  pSVar8 = this->_fs;
  SVar6 = SQFuncState::PopTarget(pSVar8);
  SQFuncState::AddInstruction(pSVar8,_OP_JZ,SVar6,1,0,0);
  SQFuncState::AddInstruction(this->_fs,_OP_JMP,0,SVar2 + ~(this->_fs->_instructions)._size,0,0);
  pSVar8 = this->_fs;
  lVar9 = (pSVar8->_unresolvedbreaks)._size - SVar3;
  lVar7 = (pSVar8->_unresolvedcontinues)._size - SVar4;
  if (0 < lVar7) {
    ResolveContinues(this,pSVar8,lVar7,SVar5 - 1);
    pSVar8 = this->_fs;
  }
  if (0 < lVar9) {
    ResolveBreaks(this,pSVar8,lVar9);
    pSVar8 = this->_fs;
  }
  pSVar1 = &(pSVar8->_breaktargets)._size;
  *pSVar1 = *pSVar1 - 1;
  pSVar1 = &(pSVar8->_continuetargets)._size;
  *pSVar1 = *pSVar1 - 1;
  return;
}

Assistant:

void DoWhileStatement()
    {
        Lex();
        SQInteger jmptrg = _fs->GetCurrentPos();
        BEGIN_BREAKBLE_BLOCK()
        BEGIN_SCOPE();
        Statement();
        END_SCOPE();
        Expect(TK_WHILE);
        SQInteger continuetrg = _fs->GetCurrentPos();
        Expect(_SC('(')); CommaExpr(); Expect(_SC(')'));
        _fs->AddInstruction(_OP_JZ, _fs->PopTarget(), 1);
        _fs->AddInstruction(_OP_JMP, 0, jmptrg - _fs->GetCurrentPos() - 1);
        END_BREAKBLE_BLOCK(continuetrg);
    }